

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcertificate.cpp
# Opt level: O2

void __thiscall
QSslCertificate::QSslCertificate(QSslCertificate *this,QIODevice *device,EncodingFormat format)

{
  QSslCertificatePrivate *this_00;
  QTlsBackend *pQVar1;
  code *pcVar2;
  iterator o;
  QLoggingCategory *pQVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<QSslCertificate> local_68;
  char *local_50;
  QArrayDataPointer<char> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QSslCertificatePrivate *)operator_new(0x10);
  QSslCertificatePrivate::QSslCertificatePrivate(this_00);
  (this->d).d.ptr = this_00;
  LOCK();
  (this_00->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (this_00->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int> + 1);
  UNLOCK();
  if (device != (QIODevice *)0x0) {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = &DAT_aaaaaaaaaaaaaaaa;
    QIODevice::readAll();
    if ((undefined1 *)local_48.size != (undefined1 *)0x0) {
      pQVar1 = QTlsBackend::activeOrAnyBackend();
      if (pQVar1 != (QTlsBackend *)0x0) {
        pcVar2 = (code *)(**(code **)(*(long *)pQVar1 + 0xe8 + (ulong)(format != Pem) * 8))(pQVar1);
        if (pcVar2 == (code *)0x0) {
          pQVar3 = QtPrivateLogging::lcSsl();
          if (((pQVar3->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
            local_50 = pQVar3->name;
            local_68.d._0_4_ = 2;
            local_68._4_8_ = (undefined1 *)0x0;
            local_68.ptr._4_4_ = 0;
            local_68.size._0_4_ = 0;
            local_68.size._4_4_ = 0;
            QMessageLogger::warning
                      ((char *)&local_68,"Current TLS plugin does not support reading from PEM/DER")
            ;
          }
        }
        else {
          local_68.size._0_4_ = 0xaaaaaaaa;
          local_68.size._4_4_ = 0xaaaaaaaa;
          local_68.d._0_4_ = 0xaaaaaaaa;
          local_68._4_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_68.ptr._4_4_ = 0xaaaaaaaa;
          (*pcVar2)(&local_68,&local_48,1);
          if (CONCAT44(local_68.size._4_4_,(undefined4)local_68.size) != 0) {
            o = QList<QSslCertificate>::begin((QList<QSslCertificate> *)&local_68);
            QExplicitlySharedDataPointer<QSslCertificatePrivate>::operator=(&this->d,&(o.i)->d);
          }
          QArrayDataPointer<QSslCertificate>::~QArrayDataPointer(&local_68);
        }
      }
    }
    QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QSslCertificate::QSslCertificate(QIODevice *device, QSsl::EncodingFormat format)
    : d(new QSslCertificatePrivate)
{
    if (device) {
        const auto data = device->readAll();
        if (data.isEmpty())
            return;

        const auto *tlsBackend = QTlsBackend::activeOrAnyBackend();
        if (!tlsBackend)
            return;

        auto *X509Reader = format == QSsl::Pem ? tlsBackend->X509PemReader() : tlsBackend->X509DerReader();
        if (!X509Reader) {
            qCWarning(lcSsl, "Current TLS plugin does not support reading from PEM/DER");
            return;
        }

        QList<QSslCertificate> certs = X509Reader(data, 1);
        if (!certs.isEmpty())
            d = certs.first().d;
    }
}